

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Rectangle::computeArea(Rectangle *this)

{
  pointer pPVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  pPVar1 = (this->m_v).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar3 = (double)(pPVar1->x - pPVar1[1].x);
  dVar2 = (double)(pPVar1->y - pPVar1[1].y);
  dVar2 = dVar2 * dVar2 + dVar3 * dVar3;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  pPVar1 = (this->m_v).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar4 = (double)(pPVar1[1].x - pPVar1[2].x);
  dVar3 = (double)(pPVar1[1].y - pPVar1[2].y);
  dVar3 = dVar3 * dVar3 + dVar4 * dVar4;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  pPVar1 = (this->m_v).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar5 = (double)(pPVar1[2].x - pPVar1[3].x);
  dVar4 = (double)(pPVar1[2].y - pPVar1[3].y);
  dVar4 = dVar4 * dVar4 + dVar5 * dVar5;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  pPVar1 = (this->m_v).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar6 = (double)(pPVar1[3].x - pPVar1->x);
  dVar5 = (double)(pPVar1[3].y - pPVar1->y);
  dVar5 = dVar5 * dVar5 + dVar6 * dVar6;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  this->m_area = (dVar2 + dVar3) * 0.5 + (dVar4 + dVar5) * 0.5;
  return;
}

Assistant:

void computeArea(){
      m_area = calculateArea(m_v);
    }